

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O0

void __thiscall mnf::RealSpace::RealSpace(RealSpace *this,Index n,ConstRefVec *magnitude)

{
  ConstRefVec *pCVar1;
  string *this_00;
  __cxx11 local_70 [32];
  string local_50 [48];
  ConstRefVec *local_20;
  ConstRefVec *magnitude_local;
  Index n_local;
  RealSpace *this_local;
  
  local_20 = magnitude;
  magnitude_local = (ConstRefVec *)n;
  n_local = (Index)this;
  Manifold::Manifold(&this->super_Manifold,n,n,n);
  (this->super_Manifold)._vptr_Manifold = (_func_int **)&PTR__RealSpace_003919a8;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->typicalMagnitude_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->trustMagnitude_);
  pCVar1 = (ConstRefVec *)
           Eigen::
           EigenBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ::size((EigenBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   *)local_20);
  if (pCVar1 != magnitude_local) {
    __assert_fail("magnitude.size() == n && \"magnitude on R^n must be of size n\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/RealSpace.cpp"
                  ,0x2e,"mnf::RealSpace::RealSpace(Index, const ConstRefVec &)");
  }
  std::__cxx11::to_string(local_70,(long)magnitude_local);
  std::operator+((char *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"R");
  this_00 = Manifold::name_abi_cxx11_(&this->super_Manifold);
  std::__cxx11::string::operator=((string *)this_00,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)local_70);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->typicalMagnitude_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(Index)magnitude_local)
  ;
  setTypicalMagnitude(this,local_20);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             ,(Index)magnitude_local);
  setTrustMagnitude(this,local_20);
  return;
}

Assistant:

RealSpace::RealSpace(Index n, const ConstRefVec& magnitude) : Manifold(n, n, n)
{
  mnf_assert(magnitude.size() == n && "magnitude on R^n must be of size n");
  name() = "R" + std::to_string(n);
  typicalMagnitude_.resize(n);
  setTypicalMagnitude(magnitude);
  trustMagnitude_.resize(n);
  setTrustMagnitude(magnitude);
}